

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::UsubBorrowCase::compare(UsubBorrowCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  uint uVar3;
  pointer pSVar4;
  uint uVar5;
  ulong uVar6;
  ostream *poVar7;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar8;
  
  pSVar4 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  uVar8 = 0;
  uVar6 = 0;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
  }
  do {
    if (uVar6 == uVar8) {
LAB_004800f5:
      return (long)(int)uVar5 <= (long)uVar8;
    }
    uVar2 = *(uint *)((long)*inputs + uVar8 * 4);
    uVar3 = *(uint *)((long)inputs[1] + uVar8 * 4);
    if ((((*(uint *)((long)*outputs + uVar8 * 4) ^ uVar2 - uVar3) &
         (2 << ((&DAT_00818ab0)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1U) != 0) ||
       (*(uint *)((long)outputs[1] + uVar8 * 4) != (uint)(uVar2 < uVar3))) {
      hex_00.value._1_7_ = 0;
      hex_00.value._0_1_ = uVar2 < uVar3;
      poVar7 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [")
      ;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar8);
      poVar7 = std::operator<<(poVar7,"] = ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar2 - uVar3;
      poVar7 = tcu::Format::operator<<(poVar7,hex);
      poVar7 = std::operator<<(poVar7,", ");
      tcu::Format::operator<<(poVar7,hex_00);
      goto LAB_004800f5;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0-in1;
			const deUint32	ref1	= in0 >= in1 ? 0u : 1u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}